

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_blind_sum
              (secp256k1_context *ctx,uchar *blind_out,uchar **blinds,size_t n,size_t npositive)

{
  secp256k1_scalar *in_RCX;
  long in_RDX;
  uchar *in_RSI;
  secp256k1_scalar *in_R8;
  int overflow;
  size_t i;
  secp256k1_scalar x;
  secp256k1_scalar acc;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  secp256k1_scalar *a;
  secp256k1_scalar *in_stack_ffffffffffffff90;
  secp256k1_scalar *in_stack_ffffffffffffffa0;
  secp256k1_scalar *in_stack_ffffffffffffffa8;
  secp256k1_scalar *in_stack_ffffffffffffffb0;
  int local_4;
  
  if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    local_4 = 0;
  }
  else if (in_RCX < in_R8) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    local_4 = 0;
  }
  else {
    secp256k1_scalar_set_int((secp256k1_scalar *)&stack0xffffffffffffffb0,0);
    for (a = (secp256k1_scalar *)0x0; a < in_RCX; a = (secp256k1_scalar *)((long)a->d + 1)) {
      secp256k1_scalar_set_b32
                (in_stack_ffffffffffffff90,(uchar *)a,
                 (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if (in_stack_ffffffffffffff84 != 0) {
        return 0;
      }
      if (in_R8 <= a) {
        secp256k1_scalar_negate(in_stack_ffffffffffffff90,a);
      }
      secp256k1_scalar_add
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
    secp256k1_scalar_get_b32(in_RSI,(secp256k1_scalar *)&stack0xffffffffffffffb0);
    secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffffb0);
    secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffff90);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_pedersen_blind_sum(const secp256k1_context* ctx, unsigned char *blind_out, const unsigned char * const *blinds, size_t n, size_t npositive) {
    secp256k1_scalar acc;
    secp256k1_scalar x;
    size_t i;
    int overflow;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(blind_out != NULL);
    ARG_CHECK(blinds != NULL);
    ARG_CHECK(npositive <= n);
    (void) ctx;
    secp256k1_scalar_set_int(&acc, 0);
    for (i = 0; i < n; i++) {
        secp256k1_scalar_set_b32(&x, blinds[i], &overflow);
        if (overflow) {
            return 0;
        }
        if (i >= npositive) {
            secp256k1_scalar_negate(&x, &x);
        }
        secp256k1_scalar_add(&acc, &acc, &x);
    }
    secp256k1_scalar_get_b32(blind_out, &acc);
    secp256k1_scalar_clear(&acc);
    secp256k1_scalar_clear(&x);
    return 1;
}